

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btSoftBodyConcaveCollisionAlgorithm::calculateTimeOfImpact::LocalTriangleSphereCastCallback::
processTriangle(LocalTriangleSphereCastCallback *this,btVector3 *triangle,int partId,
               int triangleIndex)

{
  bool bVar1;
  btSubsimplexConvexCast convexCaster;
  btTransform ident;
  btSphereShape pointShape;
  btTriangleShape triShape;
  btVoronoiSimplexSolver simplexSolver;
  btSubsimplexConvexCast local_360;
  btTransform local_340;
  btSphereShape local_300;
  btTriangleShape local_2b8;
  CastResult local_238;
  btVoronoiSimplexSolver local_178;
  
  local_340.m_basis.m_el[0].m_floats[0] = 1.0;
  local_340.m_basis.m_el[0].m_floats[1] = 0.0;
  local_340.m_basis.m_el[0].m_floats[2] = 0.0;
  local_340.m_basis.m_el[0].m_floats[3] = 0.0;
  local_340.m_basis.m_el[1].m_floats[0] = 0.0;
  local_340.m_basis.m_el[1].m_floats[1] = 1.0;
  local_340.m_basis.m_el[1].m_floats[2] = 0.0;
  local_340.m_basis.m_el[1].m_floats[3] = 0.0;
  local_340.m_basis.m_el[2].m_floats[0] = 0.0;
  local_340.m_basis.m_el[2].m_floats[1] = 0.0;
  local_340.m_basis.m_el[2].m_floats[2] = 1.0;
  local_340.m_origin.m_floats[3] = 0.0;
  local_238._vptr_CastResult = (_func_int **)&PTR_DebugDraw_001ecc78;
  local_238.m_debugDrawer = (btIDebugDraw *)0x0;
  local_238.m_allowedPenetration = 0.0;
  local_340.m_basis.m_el[2].m_floats[3] = 0.0;
  local_340.m_origin.m_floats[0] = 0.0;
  local_340.m_origin.m_floats[1] = 0.0;
  local_340.m_origin.m_floats[2] = 0.0;
  local_238.m_fraction = this->m_hitFraction;
  btSphereShape::btSphereShape(&local_300,this->m_ccdSphereRadius);
  btTriangleShape::btTriangleShape(&local_2b8,triangle,triangle + 1,triangle + 2);
  local_178.m_equalVertexThreshold = 0.0001;
  local_178.m_cachedBC.m_usedVertices._0_1_ = 0;
  btSubsimplexConvexCast::btSubsimplexConvexCast
            (&local_360,(btConvexShape *)&local_300,(btConvexShape *)&local_2b8,&local_178);
  bVar1 = btSubsimplexConvexCast::calcTimeOfImpact
                    (&local_360,&this->m_ccdSphereFromTrans,&this->m_ccdSphereToTrans,&local_340,
                     &local_340,&local_238);
  if ((bVar1) && (local_238.m_fraction < this->m_hitFraction)) {
    this->m_hitFraction = local_238.m_fraction;
  }
  btConvexCast::~btConvexCast(&local_360.super_btConvexCast);
  btPolyhedralConvexShape::~btPolyhedralConvexShape(&local_2b8.super_btPolyhedralConvexShape);
  btConvexShape::~btConvexShape((btConvexShape *)&local_300);
  return;
}

Assistant:

virtual void processTriangle(btVector3* triangle, int partId, int triangleIndex)
		{
			(void)partId;
			(void)triangleIndex;
			//do a swept sphere for now
			btTransform ident;
			ident.setIdentity();
			btConvexCast::CastResult castResult;
			castResult.m_fraction = m_hitFraction;
			btSphereShape	pointShape(m_ccdSphereRadius);
			btTriangleShape	triShape(triangle[0],triangle[1],triangle[2]);
			btVoronoiSimplexSolver	simplexSolver;
			btSubsimplexConvexCast convexCaster(&pointShape,&triShape,&simplexSolver);
			//GjkConvexCast	convexCaster(&pointShape,convexShape,&simplexSolver);
			//ContinuousConvexCollision convexCaster(&pointShape,convexShape,&simplexSolver,0);
			//local space?

			if (convexCaster.calcTimeOfImpact(m_ccdSphereFromTrans,m_ccdSphereToTrans,
				ident,ident,castResult))
			{
				if (m_hitFraction > castResult.m_fraction)
					m_hitFraction = castResult.m_fraction;
			}

		}